

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O3

RPCHelpMan * getnetworkhashps(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  string name;
  string name_00;
  string m_key_name;
  RPCResult result;
  string description;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_00;
  string description_01;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar3 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  RPCHelpMan *in_RDI;
  undefined8 uVar5;
  long lVar6;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  undefined8 in_stack_fffffffffffff8a8;
  undefined8 in_stack_fffffffffffff8b8;
  undefined8 in_stack_fffffffffffff8c0;
  undefined8 in_stack_fffffffffffff8c8;
  code *pcVar7;
  undefined8 in_stack_fffffffffffff8d0;
  pointer in_stack_fffffffffffff8d8;
  pointer pRVar8;
  pointer in_stack_fffffffffffff8e0;
  pointer pRVar9;
  pointer in_stack_fffffffffffff8e8;
  pointer pRVar10;
  undefined1 in_stack_fffffffffffff8f0 [16];
  undefined1 in_stack_fffffffffffff900 [16];
  int in_stack_fffffffffffff910;
  int iVar11;
  int iVar12;
  undefined1 in_stack_fffffffffffff918 [16];
  pointer in_stack_fffffffffffff928;
  _Alloc_hider in_stack_fffffffffffff930;
  _Alloc_hider _Var13;
  size_type in_stack_fffffffffffff938;
  undefined8 in_stack_fffffffffffff940;
  undefined8 in_stack_fffffffffffff948;
  _Alloc_hider in_stack_fffffffffffff950;
  _Alloc_hider _Var14;
  size_type in_stack_fffffffffffff958;
  undefined8 in_stack_fffffffffffff960;
  undefined8 in_stack_fffffffffffff968;
  _Alloc_hider in_stack_fffffffffffff970;
  size_type in_stack_fffffffffffff978;
  undefined8 in_stack_fffffffffffff980;
  undefined8 in_stack_fffffffffffff988;
  string local_670;
  string local_650;
  string local_630;
  ulong *local_610;
  undefined8 local_608;
  ulong local_600;
  undefined8 uStack_5f8;
  ulong *local_5f0;
  size_type local_5e8;
  ulong local_5e0;
  undefined8 uStack_5d8;
  long *local_5d0 [2];
  long local_5c0 [2];
  long *local_5b0 [2];
  long local_5a0 [2];
  RPCResult local_590;
  undefined1 local_508;
  undefined1 *local_500;
  undefined8 local_4f8;
  undefined1 local_4f0;
  undefined7 uStack_4ef;
  undefined1 local_4e0 [32];
  long *local_4c0 [2];
  long local_4b0 [2];
  UniValue local_4a0;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_448;
  undefined1 local_3f0;
  long *local_3e8 [2];
  long local_3d8 [2];
  undefined1 local_3c8;
  undefined1 *local_3c0;
  undefined8 local_3b8;
  undefined1 local_3b0;
  undefined7 uStack_3af;
  undefined1 local_3a0 [32];
  long *local_380 [2];
  long local_370;
  undefined1 auStack_368 [8];
  undefined1 local_360 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  vector<UniValue,_std::allocator<UniValue>_> local_320;
  undefined1 local_308 [40];
  long local_2e0 [6];
  __index_type local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getnetworkhashps","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nReturns the estimated network hashes per second based on the last n blocks.\nPass in [blocks] to override # of blocks, -1 specifies since last difficulty change.\nPass in [height] to estimate the network speed at the time when a certain block was found.\n"
             ,"");
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_2a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"nblocks","");
  iVar12 = 0x78;
  UniValue::UniValue<int,_int,_true>((UniValue *)local_360,(int *)&stack0xfffffffffffff914);
  local_308._8_8_ = local_308 + 0x18;
  local_308._0_4_ = local_360._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._8_8_ == &local_348) {
    local_308._32_8_ = local_348._8_8_;
  }
  else {
    local_308._8_8_ = local_360._8_8_;
  }
  local_308._16_8_ = local_360._16_8_;
  local_360._16_8_ = 0;
  local_348._M_local_buf[0] = '\0';
  local_2e0[0] = (long)local_338.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_2e0[1] = (long)local_338.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  local_2e0[2] = (long)local_338.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0[3]._0_4_ =
       local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_2e0[3]._4_4_ =
       local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_2e0[4]._0_4_ =
       local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_2e0[4]._4_4_ =
       local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_2e0[5] = (long)local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b0 = '\x02';
  local_380[0] = &local_370;
  local_360._8_8_ = &local_348;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_380,
             "The number of previous blocks to calculate estimate from, or -1 for blocks since last difficulty change."
             ,"");
  local_3c0 = &local_3b0;
  local_3c8 = 0;
  local_3b8 = 0;
  local_3b0 = 0;
  local_3a0._0_8_ = (pointer)0x0;
  local_3a0._8_2_ = 0;
  local_3a0._10_6_ = 0;
  local_3a0._16_2_ = 0;
  local_3a0._18_8_ = 0;
  name._M_string_length = (size_type)in_RDI;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8a8;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff8b8;
  name.field_2._8_8_ = in_stack_fffffffffffff8c0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff8d0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff8c8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_fffffffffffff8d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_fffffffffffff8e0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff8e8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_16_ = in_stack_fffffffffffff8f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_16_ = in_stack_fffffffffffff900;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_4_ = in_stack_fffffffffffff910;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _76_4_ = iVar12;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff918;
  description_00._M_string_length = (size_type)in_stack_fffffffffffff930._M_p;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff928;
  description_00.field_2._M_allocated_capacity = in_stack_fffffffffffff938;
  description_00.field_2._8_8_ = in_stack_fffffffffffff940;
  opts.oneline_description._M_dataplus._M_p = in_stack_fffffffffffff950._M_p;
  opts._0_8_ = in_stack_fffffffffffff948;
  opts.oneline_description._M_string_length = in_stack_fffffffffffff958;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff960;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff968;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff970._M_p;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff978;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff980;
  opts.hidden = (bool)(char)in_stack_fffffffffffff988;
  opts.also_positional = (bool)(char)((ulong)in_stack_fffffffffffff988 >> 8);
  opts._66_6_ = (int6)((ulong)in_stack_fffffffffffff988 >> 0x10);
  RPCArg::RPCArg(&local_288,name,(Type)&local_2a8,fallback,description_00,opts);
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"height","");
  iVar11 = -1;
  UniValue::UniValue<int,_int,_true>(&local_4a0,(int *)&stack0xfffffffffffff910);
  paVar1 = &local_4a0.val.field_2;
  local_448._8_8_ = (long)&local_448 + 0x18;
  local_448._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_4a0.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0.val._M_dataplus._M_p == paVar1) {
    local_448._32_8_ = local_4a0.val.field_2._8_8_;
  }
  else {
    local_448._8_8_ = local_4a0.val._M_dataplus._M_p;
  }
  local_448._16_8_ = local_4a0.val._M_string_length;
  local_4a0.val._M_string_length = 0;
  local_4a0.val.field_2._M_local_buf[0] = '\0';
  local_448._40_8_ =
       local_4a0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_448._48_8_ =
       local_4a0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_448._56_8_ =
       local_4a0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_4a0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_448._64_4_ =
       local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_448._68_4_ =
       local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_448._72_4_ =
       local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_448._76_4_ =
       local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_448._80_8_ =
       local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f0 = 2;
  local_4c0[0] = local_4b0;
  local_4a0.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c0,"To estimate at the time of the given height.","");
  local_500 = &local_4f0;
  local_508 = 0;
  local_4f8 = 0;
  local_4f0 = 0;
  local_4e0._0_8_ = (pointer)0x0;
  local_4e0._8_2_ = 0;
  local_4e0._10_6_ = 0;
  local_4e0._16_2_ = 0;
  local_4e0._18_8_ = 0;
  name_00._M_string_length = (size_type)in_RDI;
  name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8a8;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff8b8;
  name_00.field_2._8_8_ = in_stack_fffffffffffff8c0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff8d0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff8c8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_fffffffffffff8d8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_fffffffffffff8e0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff8e8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_16_ = in_stack_fffffffffffff8f0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_16_ = in_stack_fffffffffffff900;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_4_ = iVar11;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _76_4_ = iVar12;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff918;
  description_01._M_string_length = (size_type)in_stack_fffffffffffff930._M_p;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff928;
  description_01.field_2._M_allocated_capacity = in_stack_fffffffffffff938;
  description_01.field_2._8_8_ = in_stack_fffffffffffff940;
  opts_00.oneline_description._M_dataplus._M_p = in_stack_fffffffffffff950._M_p;
  opts_00._0_8_ = in_stack_fffffffffffff948;
  opts_00.oneline_description._M_string_length = in_stack_fffffffffffff958;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff960;
  opts_00.oneline_description.field_2._8_8_ = in_stack_fffffffffffff968;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff970._M_p;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff978;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff980;
  opts_00.hidden = (bool)(char)in_stack_fffffffffffff988;
  opts_00.also_positional = (bool)(char)((ulong)in_stack_fffffffffffff988 >> 8);
  opts_00._66_6_ = (int6)((ulong)in_stack_fffffffffffff988 >> 0x10);
  RPCArg::RPCArg(&local_180,name_00,(Type)local_3e8,fallback_00,description_01,opts_00);
  __l._M_len = 2;
  __l._M_array = &local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff918,__l,
             (allocator_type *)&stack0xfffffffffffff90f);
  local_5b0[0] = local_5a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"");
  local_5d0[0] = local_5c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5d0,"Hashes per second estimated","");
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8a8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff8b8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff8c0;
  auVar3._16_8_ = 0;
  auVar3._0_16_ = in_stack_fffffffffffff8f0;
  RPCResult::RPCResult
            (&local_590,NUM,m_key_name,
             (string)ZEXT1632(CONCAT88(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8)),
             (vector<RPCResult,_std::allocator<RPCResult>_>)(auVar3 << 0x40),SUB81(local_5b0,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffff8a8;
  result.m_key_name._M_string_length = in_stack_fffffffffffff8b8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff8c0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff8c8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8d0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar9;
  result._64_8_ = pRVar10;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8f0._0_8_;
  result.m_description._M_string_length = in_stack_fffffffffffff8f0._8_8_;
  result.m_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff900;
  result.m_cond._M_dataplus._M_p._0_4_ = iVar11;
  result.m_cond._M_dataplus._M_p._4_4_ = iVar12;
  result.m_cond._8_16_ = in_stack_fffffffffffff918;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff928;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff8f0,result);
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"getnetworkhashps","");
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"");
  HelpExampleCli(&local_630,&local_650,&local_670);
  _Var14._M_p = &stack0xfffffffffffff960;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff950,"getnetworkhashps","");
  _Var13._M_p = &stack0xfffffffffffff940;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff930,"");
  HelpExampleRpc((string *)&stack0xfffffffffffff970,(string *)&stack0xfffffffffffff950,
                 (string *)&stack0xfffffffffffff930);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    uVar5 = local_630.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < in_stack_fffffffffffff978 + local_630._M_string_length) {
    uVar5 = 0xf;
    if (in_stack_fffffffffffff970._M_p != &stack0xfffffffffffff980) {
      uVar5 = in_stack_fffffffffffff980;
    }
    if (in_stack_fffffffffffff978 + local_630._M_string_length <= (ulong)uVar5) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffff970,0,0,local_630._M_dataplus._M_p,
                       local_630._M_string_length);
      goto LAB_00318aa3;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_630,in_stack_fffffffffffff970._M_p,in_stack_fffffffffffff978);
LAB_00318aa3:
  local_610 = &local_600;
  puVar2 = (ulong *)(pbVar4->_M_dataplus)._M_p;
  paVar1 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_600 = paVar1->_M_allocated_capacity;
    uStack_5f8 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_600 = paVar1->_M_allocated_capacity;
    local_610 = puVar2;
  }
  local_5e8 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_610 == &local_600) {
    uStack_5d8 = uStack_5f8;
    local_5f0 = &local_5e0;
  }
  else {
    local_5f0 = local_610;
  }
  local_5e0 = local_600;
  local_608 = 0;
  local_600 = local_600 & 0xffffffffffffff00;
  pcVar7 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mining.cpp:124:9)>
           ::_M_manager;
  description._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mining.cpp:124:9)>
       ::_M_invoke;
  description._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mining.cpp:124:9)>
                ::_M_manager;
  description.field_2._M_allocated_capacity = (size_type)pRVar8;
  description.field_2._8_8_ = pRVar9;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_fffffffffffff8f0._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffff8f0._8_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = pRVar10;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = iVar11;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff900._0_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff900._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = iVar12;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff928;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff918._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff918._8_8_;
  examples.m_examples.field_2._8_8_ = _Var13._M_p;
  local_610 = &local_600;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff8b8)),description,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar7 != (code *)0x0) {
    (*pcVar7)(&stack0xfffffffffffff8b8,&stack0xfffffffffffff8b8,3);
  }
  if (local_5f0 != &local_5e0) {
    operator_delete(local_5f0,local_5e0 + 1);
  }
  if (local_610 != &local_600) {
    operator_delete(local_610,local_600 + 1);
  }
  if (in_stack_fffffffffffff970._M_p != &stack0xfffffffffffff980) {
    operator_delete(in_stack_fffffffffffff970._M_p,in_stack_fffffffffffff980 + 1);
  }
  if (_Var13._M_p != &stack0xfffffffffffff940) {
    operator_delete(_Var13._M_p,in_stack_fffffffffffff940 + 1);
  }
  if (_Var14._M_p != &stack0xfffffffffffff960) {
    operator_delete(_Var14._M_p,in_stack_fffffffffffff960 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590.m_cond._M_dataplus._M_p != &local_590.m_cond.field_2) {
    operator_delete(local_590.m_cond._M_dataplus._M_p,
                    local_590.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590.m_description._M_dataplus._M_p != &local_590.m_description.field_2) {
    operator_delete(local_590.m_description._M_dataplus._M_p,
                    local_590.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_590.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590.m_key_name._M_dataplus._M_p != &local_590.m_key_name.field_2) {
    operator_delete(local_590.m_key_name._M_dataplus._M_p,
                    local_590.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8d8);
  if (local_5d0[0] != local_5c0) {
    operator_delete(local_5d0[0],local_5c0[0] + 1);
  }
  if (local_5b0[0] != local_5a0) {
    operator_delete(local_5b0[0],local_5a0[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff918);
  lVar6 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar6));
    if ((long *)(local_308 + lVar6 + 0x50) != *(long **)(local_308 + lVar6 + 0x40)) {
      operator_delete(*(long **)(local_308 + lVar6 + 0x40),*(long *)(local_308 + lVar6 + 0x50) + 1);
    }
    if ((long *)(local_308 + lVar6 + 0x28) != *(long **)(local_308 + lVar6 + 0x18)) {
      operator_delete(*(long **)(local_308 + lVar6 + 0x18),*(long *)(local_308 + lVar6 + 0x28) + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(local_360 + lVar6 + 0x10));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)(auStack_368 + lVar6));
    if ((long *)((long)local_380 + lVar6) != *(long **)(local_3a0 + lVar6 + 0x10)) {
      operator_delete(*(long **)(local_3a0 + lVar6 + 0x10),*(long *)((long)local_380 + lVar6) + 1);
    }
    lVar6 = lVar6 + -0x108;
  } while (lVar6 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4e0);
  if (local_500 != &local_4f0) {
    operator_delete(local_500,CONCAT71(uStack_4ef,local_4f0) + 1);
  }
  if (local_4c0[0] != local_4b0) {
    operator_delete(local_4c0[0],local_4b0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_448._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4a0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4a0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0.val._M_dataplus._M_p != &local_4a0.val.field_2) {
    operator_delete(local_4a0.val._M_dataplus._M_p,
                    CONCAT71(local_4a0.val.field_2._M_allocated_capacity._1_7_,
                             local_4a0.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3a0);
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,CONCAT71(uStack_3af,local_3b0) + 1);
  }
  if (local_380[0] != &local_370) {
    operator_delete(local_380[0],local_370 + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)local_308);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_320);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._8_8_ != &local_348) {
    operator_delete((void *)local_360._8_8_,
                    CONCAT71(local_348._M_allocated_capacity._1_7_,local_348._M_local_buf[0]) + 1);
  }
  if (local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_2a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_2a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getnetworkhashps()
{
    return RPCHelpMan{"getnetworkhashps",
                "\nReturns the estimated network hashes per second based on the last n blocks.\n"
                "Pass in [blocks] to override # of blocks, -1 specifies since last difficulty change.\n"
                "Pass in [height] to estimate the network speed at the time when a certain block was found.\n",
                {
                    {"nblocks", RPCArg::Type::NUM, RPCArg::Default{120}, "The number of previous blocks to calculate estimate from, or -1 for blocks since last difficulty change."},
                    {"height", RPCArg::Type::NUM, RPCArg::Default{-1}, "To estimate at the time of the given height."},
                },
                RPCResult{
                    RPCResult::Type::NUM, "", "Hashes per second estimated"},
                RPCExamples{
                    HelpExampleCli("getnetworkhashps", "")
            + HelpExampleRpc("getnetworkhashps", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    ChainstateManager& chainman = EnsureAnyChainman(request.context);
    LOCK(cs_main);
    return GetNetworkHashPS(self.Arg<int>("nblocks"), self.Arg<int>("height"), chainman.ActiveChain());
},
    };
}